

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.h
# Opt level: O0

uint32_t __thiscall
ymfm::opl_registers_base<4>::word
          (opl_registers_base<4> *this,uint32_t offset1,uint32_t start1,uint32_t count1,
          uint32_t offset2,uint32_t start2,uint32_t count2,uint32_t extra_offset)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t start2_local;
  uint32_t offset2_local;
  uint32_t count1_local;
  uint32_t start1_local;
  uint32_t offset1_local;
  opl_registers_base<4> *this_local;
  
  uVar1 = byte(this,offset1,start1,count1,extra_offset);
  uVar2 = byte(this,offset2,start2,count2,extra_offset);
  return uVar1 << ((byte)count2 & 0x1f) | uVar2;
}

Assistant:

uint32_t word(uint32_t offset1, uint32_t start1, uint32_t count1, uint32_t offset2, uint32_t start2, uint32_t count2, uint32_t extra_offset = 0) const
	{
		return (byte(offset1, start1, count1, extra_offset) << count2) | byte(offset2, start2, count2, extra_offset);
	}